

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ostream *poVar1;
  int local_1c;
  int index;
  char **argv_local;
  int argc_local;
  
  for (local_1c = 0; local_1c < argc; local_1c = local_1c + 1) {
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_1c);
    poVar1 = std::operator<<(poVar1,": ");
    poVar1 = std::operator<<(poVar1,argv[local_1c]);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
  for (int index = 0; index < argc; index++) {
    cout << index << ": " << argv[index] << endl;
  }
  return 0;
}